

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppLVar4;
  undefined8 uVar5;
  void *pvVar6;
  long in_RDI;
  int cret;
  Option opt1;
  Layer *layer_1;
  int i_1;
  int lret;
  Layer *layer;
  int i;
  ModelBinFromDataReader mb;
  int ret;
  int layer_count;
  undefined8 in_stack_ffffffffffffff18;
  PoolAllocator *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff34;
  DataReader *in_stack_ffffffffffffff38;
  FILE *pFVar8;
  uint in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  value_type local_60;
  uint local_58;
  int local_44;
  value_type local_40;
  uint local_34;
  undefined1 local_30 [16];
  int local_20;
  int local_1c;
  int local_4;
  
  bVar1 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::empty
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (bVar1) {
    fprintf(_stderr,"network graph not ready");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       (*(long *)(in_RDI + 0x48) + 0x20));
    local_1c = (int)sVar3;
    local_20 = 0;
    ModelBinFromDataReader::ModelBinFromDataReader
              ((ModelBinFromDataReader *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    for (local_34 = 0; (int)local_34 < local_1c; local_34 = local_34 + 1) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           (*(long *)(in_RDI + 0x48) + 0x20),(long)(int)local_34);
      local_40 = *ppLVar4;
      if (local_40 == (value_type)0x0) {
        fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.",
                (ulong)local_34);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
      in_stack_ffffffffffffff44 = (*local_40->_vptr_Layer[3])(local_40,local_30);
      local_44 = in_stack_ffffffffffffff44;
      if (in_stack_ffffffffffffff44 != 0) {
        pFVar8 = _stderr;
        in_stack_ffffffffffffff40 = local_34;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"layer load_model %d %s failed",(ulong)in_stack_ffffffffffffff40,uVar5);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
      if ((local_40->support_int8_storage & 1U) != 0) {
        *(undefined1 *)(in_RDI + 0x27) = 0;
      }
    }
    for (local_58 = 0; (int)local_58 < local_1c; local_58 = local_58 + 1) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           (*(long *)(in_RDI + 0x48) + 0x20),(long)(int)local_58);
      local_60 = *ppLVar4;
      local_a8 = *(undefined4 *)(in_RDI + 8);
      uStack_a4 = *(undefined4 *)(in_RDI + 0xc);
      uStack_a0 = *(undefined4 *)(in_RDI + 0x10);
      uStack_9c = *(undefined4 *)(in_RDI + 0x14);
      local_98 = *(undefined4 *)(in_RDI + 0x18);
      uStack_94 = *(undefined4 *)(in_RDI + 0x1c);
      uStack_90 = *(undefined4 *)(in_RDI + 0x20);
      uStack_8c = *(undefined4 *)(in_RDI + 0x24);
      local_88 = *(undefined4 *)(in_RDI + 0x28);
      uStack_84 = *(undefined4 *)(in_RDI + 0x2c);
      uStack_80 = *(undefined4 *)(in_RDI + 0x30);
      uStack_7c = *(undefined4 *)(in_RDI + 0x34);
      local_78 = *(undefined4 *)(in_RDI + 0x38);
      uStack_74 = *(undefined4 *)(in_RDI + 0x3c);
      uStack_70 = *(undefined4 *)(in_RDI + 0x40);
      uStack_6c = *(undefined4 *)(in_RDI + 0x44);
      iVar2 = (*local_60->_vptr_Layer[4])(local_60,&local_a8);
      pFVar8 = _stderr;
      if (iVar2 != 0) {
        uVar7 = local_58;
        uVar5 = std::__cxx11::string::c_str();
        fprintf(pFVar8,"layer create_pipeline %d %s failed",(ulong)uVar7,uVar5);
        fprintf(_stderr,"\n");
        local_20 = -1;
        break;
      }
    }
    if ((*(byte *)(in_RDI + 0x3c) & 1) != 0) {
      if ((*(long *)(in_RDI + 0x10) == 0) && (*(long *)(*(long *)(in_RDI + 0x48) + 0xb0) == 0)) {
        in_stack_ffffffffffffff20 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator
                  ((PoolAllocator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        *(PoolAllocator **)(*(long *)(in_RDI + 0x48) + 0xb0) = in_stack_ffffffffffffff20;
        PoolAllocator::set_size_compare_ratio
                  (in_stack_ffffffffffffff20,(float)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      }
      if ((*(long *)(in_RDI + 0x18) == 0) && (*(long *)(*(long *)(in_RDI + 0x48) + 0xb8) == 0)) {
        pvVar6 = operator_new(0x10);
        PoolAllocator::PoolAllocator
                  ((PoolAllocator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        *(void **)(*(long *)(in_RDI + 0x48) + 0xb8) = pvVar6;
        PoolAllocator::set_size_compare_ratio
                  (in_stack_ffffffffffffff20,(float)((ulong)pvVar6 >> 0x20));
      }
    }
    local_4 = local_20;
    ModelBinFromDataReader::~ModelBinFromDataReader
              ((ModelBinFromDataReader *)in_stack_ffffffffffffff20);
  }
  return local_4;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.5f);
            }
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}